

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe48At5(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 7) << 0x10) << 0x1d;
  uVar3 = ((uint)(buf[6] >> 3) | (uint)buf[5] << 5 | (uint)buf[4] << 0xd | (uint)buf[3] << 0x15) |
          uVar2;
  uVar1 = uVar3 | 0xffff000000000000;
  if (uVar2 >> 0x2f == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe48At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 5;
    res |= (buf[6] >> 3);
    res &= UINT64_C(0xffffffffffff);

    if (res >> 47) {
        res |= UINT64_C(0xffff000000000000);
    }

    return static_cast<std::int64_t>(res);
}